

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

ON_SubDVertex * __thiscall
ON_SubD_FixedSizeHeap::FindOrAllocateVertex(ON_SubD_FixedSizeHeap *this,ON_SubDEdge *edge0)

{
  uint hash_00;
  ON_SubDComponentPtr component0_00;
  ON_SubDVertex *v1;
  uint hash;
  ON_SubDComponentPtr component0;
  ON_SubDEdge *edge0_local;
  ON_SubD_FixedSizeHeap *this_local;
  
  if (edge0 == (ON_SubDEdge *)0x0) {
    ON_SubDIncrementErrorCount();
    this_local = (ON_SubD_FixedSizeHeap *)0x0;
  }
  else {
    component0_00 = ON_SubDComponentPtr::Create(edge0);
    hash_00 = Internal_Hash(this,component0_00);
    this_local = (ON_SubD_FixedSizeHeap *)Internal_HashFindVertex1(this,hash_00,component0_00);
    if ((ON_SubDVertex *)this_local == (ON_SubDVertex *)0x0) {
      this_local = (ON_SubD_FixedSizeHeap *)AllocateVertex(this,edge0);
      if ((ON_SubDVertex *)this_local == (ON_SubDVertex *)0x0) {
        ON_SubDIncrementErrorCount();
        this_local = (ON_SubD_FixedSizeHeap *)0x0;
      }
      else {
        Internal_HashAddPair(this,hash_00,component0_00,(ON_SubDVertex *)this_local);
      }
    }
    else if (((ON_SubDVertex *)this_local)->m_edge_capacity < 4) {
      ON_SubDIncrementErrorCount();
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_heap.cpp"
                 ,0x20d,"","edge capacity was too small when vertex was created.");
    }
  }
  return (ON_SubDVertex *)this_local;
}

Assistant:

ON_SubDVertex * ON_SubD_FixedSizeHeap::FindOrAllocateVertex(const ON_SubDEdge * edge0)
{
  if ( nullptr == edge0)
    return ON_SUBD_RETURN_ERROR(nullptr);

  const ON_SubDComponentPtr component0 = ON_SubDComponentPtr::Create(edge0);
  const unsigned int hash = Internal_Hash(component0);
  ON_SubDVertex* v1 = Internal_HashFindVertex1(hash, component0);

  if (nullptr != v1)
  {
    // found the previously allocated vertex
    if (((unsigned int)v1->m_edge_capacity) < 4)
    {
      ON_SUBD_ERROR("edge capacity was too small when vertex was created.");
    }
    return v1;
  }

  v1 = AllocateVertex(edge0);
  if (nullptr == v1)
    return ON_SUBD_RETURN_ERROR(nullptr);
  Internal_HashAddPair(hash, component0, v1);

  return v1;
}